

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

SUNErrCode erkStep_SUNStepperReInit(SUNStepper_conflict stepper,sunrealtype t0,N_Vector y0)

{
  int iVar1;
  SUNErrCode SVar2;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  void *arkode_mem;
  ARKodeERKStepMem local_30;
  ARKodeMem local_28;
  void *local_20;
  
  SUNStepper_GetContent(stepper,&local_20);
  iVar1 = erkStep_AccessARKODEStepMem(local_20,"erkStepSUNStepperReInit",&local_28,&local_30);
  if (iVar1 == 0) {
    iVar1 = ERKStepReInit(local_20,local_30->f,t0,y0);
    stepper->last_flag = iVar1;
    if (iVar1 == 0) {
      SVar2 = 0;
    }
    else {
      arkProcessError(local_28,iVar1,0x69d,"erkStep_SUNStepperReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                      ,"ERKStepReInit return an error\n");
      SVar2 = -0x2706;
    }
  }
  else {
    SVar2 = -0x16;
    arkProcessError((ARKodeMem)0x0,-0x16,0x695,"erkStep_SUNStepperReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"The ARKStep memory pointer is NULL");
  }
  return SVar2;
}

Assistant:

static SUNErrCode erkStep_SUNStepperReInit(SUNStepper stepper, sunrealtype t0,
                                           N_Vector y0)
{
  SUNFunctionBegin(stepper->sunctx);

  void* arkode_mem;
  SUNCheckCall(SUNStepper_GetContent(stepper, &arkode_mem));

  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval = erkStep_AccessARKODEStepMem(arkode_mem, "erkStepSUNStepperReInit",
                                           &ark_mem, &step_mem);
  if (retval)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The ARKStep memory pointer is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->last_flag = ERKStepReInit(arkode_mem, step_mem->f, t0, y0);
  if (stepper->last_flag != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, stepper->last_flag, __LINE__, __func__, __FILE__,
                    "ERKStepReInit return an error\n");
    return SUN_ERR_OP_FAIL;
  }

  return SUN_SUCCESS;
}